

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3ExprGlobalHitsCb(Fts3Expr *pExpr,int iPhrase,void *pCtx)

{
  int iVar1;
  MatchInfo *p;
  void *pCtx_local;
  int iPhrase_local;
  Fts3Expr *pExpr_local;
  
  iVar1 = sqlite3Fts3EvalPhraseStats
                    (*pCtx,pExpr,
                     (u32 *)(*(long *)((long)pCtx + 0x20) +
                            (long)(iPhrase * 3 * *(int *)((long)pCtx + 8)) * 4));
  return iVar1;
}

Assistant:

static int fts3ExprGlobalHitsCb(
  Fts3Expr *pExpr,                /* Phrase expression node */
  int iPhrase,                    /* Phrase number (numbered from zero) */
  void *pCtx                      /* Pointer to MatchInfo structure */
){
  MatchInfo *p = (MatchInfo *)pCtx;
  return sqlite3Fts3EvalPhraseStats(
      p->pCursor, pExpr, &p->aMatchinfo[3*iPhrase*p->nCol]
  );
}